

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int mbedtls_pem_write_buffer
              (char *header,char *footer,uchar *der_data,size_t der_len,uchar *buf,size_t buf_len,
              size_t *olen)

{
  ulong dlen;
  char *pcVar1;
  uchar *puVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uchar *dst;
  uchar *__src;
  uchar *__dest;
  uchar *puVar7;
  ulong local_50;
  char *local_48;
  char *local_40;
  uchar *local_38;
  
  local_38 = buf;
  mbedtls_base64_encode((uchar *)0x0,0,&local_50,der_data,der_len);
  local_48 = header;
  sVar4 = strlen(header);
  local_40 = footer;
  sVar5 = strlen(footer);
  dlen = local_50;
  uVar6 = sVar5 + sVar4 + local_50 + (local_50 >> 6) + 1;
  if (buf_len < uVar6) {
    *olen = uVar6;
    iVar3 = -0x2a;
  }
  else {
    if (local_50 == 0) {
      dst = (uchar *)0x0;
    }
    else {
      dst = (uchar *)calloc(1,local_50);
      if (dst == (uchar *)0x0) {
        return -0x1180;
      }
    }
    iVar3 = mbedtls_base64_encode(dst,dlen,&local_50,der_data,der_len);
    pcVar1 = local_48;
    if (iVar3 == 0) {
      sVar4 = strlen(local_48);
      puVar2 = local_38;
      memcpy(local_38,pcVar1,sVar4);
      sVar4 = strlen(pcVar1);
      __dest = puVar2 + sVar4;
      __src = dst;
      if (local_50 != 0) {
        do {
          sVar4 = 0x40;
          if (local_50 < 0x40) {
            sVar4 = local_50;
          }
          memcpy(__dest,__src,sVar4);
          puVar7 = __dest + sVar4;
          __dest = puVar7 + 1;
          *puVar7 = '\n';
          local_50 = local_50 - sVar4;
          __src = __src + sVar4;
        } while (local_50 != 0);
        local_50 = 0;
      }
      pcVar1 = local_40;
      sVar4 = strlen(local_40);
      memcpy(__dest,pcVar1,sVar4);
      sVar4 = strlen(pcVar1);
      __dest[sVar4] = '\0';
      *olen = (size_t)(__dest + (sVar4 - (long)puVar2) + 1);
      free(dst);
      iVar3 = 0;
    }
    else {
      free(dst);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_pem_write_buffer( const char *header, const char *footer,
                      const unsigned char *der_data, size_t der_len,
                      unsigned char *buf, size_t buf_len, size_t *olen )
{
    int ret;
    unsigned char *encode_buf = NULL, *c, *p = buf;
    size_t len = 0, use_len, add_len = 0;

    mbedtls_base64_encode( NULL, 0, &use_len, der_data, der_len );
    add_len = strlen( header ) + strlen( footer ) + ( use_len / 64 ) + 1;

    if( use_len + add_len > buf_len )
    {
        *olen = use_len + add_len;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    if( use_len != 0 &&
        ( ( encode_buf = mbedtls_calloc( 1, use_len ) ) == NULL ) )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_encode( encode_buf, use_len, &use_len, der_data,
                               der_len ) ) != 0 )
    {
        mbedtls_free( encode_buf );
        return( ret );
    }

    memcpy( p, header, strlen( header ) );
    p += strlen( header );
    c = encode_buf;

    while( use_len )
    {
        len = ( use_len > 64 ) ? 64 : use_len;
        memcpy( p, c, len );
        use_len -= len;
        p += len;
        c += len;
        *p++ = '\n';
    }

    memcpy( p, footer, strlen( footer ) );
    p += strlen( footer );

    *p++ = '\0';
    *olen = p - buf;

    mbedtls_free( encode_buf );
    return( 0 );
}